

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  LogMessage *pLVar1;
  Type *pTVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x498);
    pLVar1 = LogMessage::operator<<(&local_48,"CHECK failed: GetArena() == nullptr: ");
    pLVar1 = LogMessage::operator<<
                       (pLVar1,"ReleaseLast() called on a RepeatedPtrField that is on an arena, ");
    pLVar1 = LogMessage::operator<<
                       (pLVar1,"with a type that does not implement MergeFrom. This is unsafe; ");
    pLVar1 = LogMessage::operator<<(pLVar1,"please implement MergeFrom for your type.");
    LogFinisher::operator=(&local_49,pLVar1);
    LogMessage::~LogMessage(&local_48);
  }
  pTVar2 = UnsafeArenaReleaseLast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                     (this);
  return pTVar2;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::false_type) {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ReleaseLast() called on a RepeatedPtrField that is on an arena, "
      << "with a type that does not implement MergeFrom. This is unsafe; "
      << "please implement MergeFrom for your type.";
  return UnsafeArenaReleaseLast<TypeHandler>();
}